

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::normalizeOffset(DateTimePickerPrivate *this,int section)

{
  int size;
  int iVar1;
  int iVar2;
  const_reference pSVar3;
  qsizetype qVar4;
  reference pSVar5;
  int totalItemHeight;
  int sectionValuesSize;
  int section_local;
  DateTimePickerPrivate *this_local;
  
  pSVar3 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
  qVar4 = QList<QString>::size(&pSVar3->values);
  size = (int)qVar4;
  iVar1 = this->itemHeight + this->itemTopMargin;
  while( true ) {
    while( true ) {
      pSVar3 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
      iVar2 = qAbs<int>(&pSVar3->offset);
      if (iVar2 <= iVar1 / 2) {
        return;
      }
      pSVar3 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
      if (0 < pSVar3->offset) break;
      if (size < this->itemsMaxCount) {
        pSVar5 = QList<QtMWidgets::Section>::operator[]
                           (&(this->super_DateTimeParser).sections,(long)section);
        iVar2 = pSVar5->currentIndex;
        pSVar5 = QList<QtMWidgets::Section>::operator[]
                           (&(this->super_DateTimeParser).sections,(long)section);
        qVar4 = QList<QString>::size(&pSVar5->values);
        if ((long)iVar2 == qVar4 + -1) {
          pSVar5 = QList<QtMWidgets::Section>::operator[]
                             (&(this->super_DateTimeParser).sections,(long)section);
          pSVar5->offset = 0;
          return;
        }
      }
      pSVar5 = QList<QtMWidgets::Section>::operator[]
                         (&(this->super_DateTimeParser).sections,(long)section);
      pSVar5->offset = iVar1 + pSVar5->offset;
      pSVar3 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
      iVar2 = nextIndex(pSVar3->currentIndex,size);
      pSVar5 = QList<QtMWidgets::Section>::operator[]
                         (&(this->super_DateTimeParser).sections,(long)section);
      pSVar5->currentIndex = iVar2;
    }
    if ((size < this->itemsMaxCount) &&
       (pSVar5 = QList<QtMWidgets::Section>::operator[]
                           (&(this->super_DateTimeParser).sections,(long)section),
       pSVar5->currentIndex == 0)) break;
    pSVar5 = QList<QtMWidgets::Section>::operator[]
                       (&(this->super_DateTimeParser).sections,(long)section);
    pSVar5->offset = pSVar5->offset - iVar1;
    pSVar3 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)section);
    iVar2 = prevIndex(pSVar3->currentIndex,size);
    pSVar5 = QList<QtMWidgets::Section>::operator[]
                       (&(this->super_DateTimeParser).sections,(long)section);
    pSVar5->currentIndex = iVar2;
  }
  pSVar5 = QList<QtMWidgets::Section>::operator[]
                     (&(this->super_DateTimeParser).sections,(long)section);
  pSVar5->offset = 0;
  return;
}

Assistant:

void
DateTimePickerPrivate::normalizeOffset( int section )
{
	const int sectionValuesSize = sections.at( section ).values.size();
	const int totalItemHeight = itemHeight + itemTopMargin;

	while( qAbs( sections.at( section ).offset ) > totalItemHeight / 2 )
	{
		if( sections.at( section ).offset > 0 )
		{
			if( sectionValuesSize < itemsMaxCount &&
				sections[ section ].currentIndex == 0 )
			{
				sections[ section ].offset = 0;
				break;
			}

			sections[ section ].offset -= totalItemHeight;
			sections[ section ].currentIndex = prevIndex(
				sections.at( section ).currentIndex, sectionValuesSize );
		}
		else
		{
			if( sectionValuesSize < itemsMaxCount &&
				sections[ section ].currentIndex ==
					sections[ section ].values.size() - 1 )
			{
				sections[ section ].offset = 0;
				break;
			}

			sections[ section ].offset += totalItemHeight;
			sections[ section ].currentIndex = nextIndex(
				sections.at( section ).currentIndex, sectionValuesSize );
		}
	}
}